

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O2

FT_Error pfr_glyph_line_to(PFR_Glyph glyph,FT_Vector *to)

{
  short *psVar1;
  FT_Vector *pFVar2;
  FT_GlyphLoader loader;
  FT_Pos FVar3;
  short sVar4;
  FT_Error FVar5;
  
  if (glyph->path_begun == '\0') {
    return 8;
  }
  loader = glyph->loader;
  sVar4 = (loader->current).outline.n_points;
  if (loader->max_points < (int)(loader->base).outline.n_points + (int)sVar4 + 1U) {
    FVar5 = FT_GlyphLoader_CheckPoints(loader,1,0);
    if (FVar5 != 0) {
      return FVar5;
    }
    sVar4 = (loader->current).outline.n_points;
  }
  FVar3 = to->y;
  pFVar2 = (loader->current).outline.points + sVar4;
  pFVar2->x = to->x;
  pFVar2->y = FVar3;
  (loader->current).outline.tags[sVar4] = '\x01';
  psVar1 = &(loader->current).outline.n_points;
  *psVar1 = *psVar1 + 1;
  return 0;
}

Assistant:

static FT_Error
  pfr_glyph_line_to( PFR_Glyph   glyph,
                     FT_Vector*  to )
  {
    FT_GlyphLoader  loader  = glyph->loader;
    FT_Outline*     outline = &loader->current.outline;
    FT_Error        error;


    /* check that we have begun a new path */
    if ( !glyph->path_begun )
    {
      error = FT_THROW( Invalid_Table );
      FT_ERROR(( "pfr_glyph_line_to: invalid glyph data\n" ));
      goto Exit;
    }

    error = FT_GLYPHLOADER_CHECK_POINTS( loader, 1, 0 );
    if ( !error )
    {
      FT_Int  n = outline->n_points;


      outline->points[n] = *to;
      outline->tags  [n] = FT_CURVE_TAG_ON;

      outline->n_points++;
    }

  Exit:
    return error;
  }